

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS
ref_gather_node(REF_NODE ref_node,REF_BOOL swap_endian,REF_INT version,REF_BOOL twod,FILE *file)

{
  undefined8 *puVar1;
  REF_DBL *pRVar2;
  FILE *__s;
  uint uVar3;
  uint uVar4;
  REF_STATUS RVar5;
  void *__s_00;
  void *__ptr;
  long lVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  REF_STATUS ref_private_macro_code_rxs;
  long lVar11;
  ulong uVar12;
  long lVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  double dVar17;
  REF_DBL swapped_dbl;
  REF_BOOL node_not_used_once;
  REF_INT local;
  uint local_ac;
  ulong local_a8;
  REF_BOOL local_a0;
  REF_BOOL local_9c;
  REF_NODE local_98;
  REF_MPI local_90;
  long local_88;
  ulong local_80;
  uint local_74;
  REF_BOOL local_70;
  int local_6c;
  void *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  size_t local_48;
  FILE *local_40;
  ulong local_38;
  
  local_90 = ref_node->ref_mpi;
  local_9c = 0;
  uVar3 = (int)(ref_node->old_n_global / (long)local_90->n) + 1;
  uVar4 = 0x7fffffff;
  if (0 < local_90->reduce_byte_limit) {
    uVar4 = (uint)local_90->reduce_byte_limit >> 5;
  }
  if ((int)uVar3 < (int)uVar4) {
    uVar4 = uVar3;
  }
  local_a0 = swap_endian;
  local_98 = ref_node;
  local_70 = twod;
  if ((int)uVar3 < 0) {
    pcVar10 = "malloc local_xyzm of REF_DBL negative";
    uVar16 = 0x4ba;
LAB_001a9c02:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar16
           ,"ref_gather_node",pcVar10);
    local_ac = 1;
  }
  else {
    uVar3 = uVar4 * 4;
    __s_00 = malloc((ulong)uVar3 << 3);
    if (__s_00 == (void *)0x0) {
      pcVar10 = "malloc local_xyzm of REF_DBL NULL";
      uVar16 = 0x4ba;
    }
    else {
      __ptr = malloc((ulong)uVar3 << 3);
      if (__ptr != (void *)0x0) {
        lVar13 = local_98->old_n_global;
        local_68 = __ptr;
        if (0 < lVar13) {
          local_74 = version - 1;
          if ((int)uVar3 < 2) {
            uVar3 = 1;
          }
          local_48 = (ulong)uVar3 << 3;
          lVar8 = 0;
          local_58 = (ulong)uVar4;
          local_50 = (ulong)uVar4;
          local_40 = (FILE *)file;
          local_38 = (ulong)(uint)version;
          do {
            uVar9 = lVar13 - lVar8;
            if ((long)local_58 < lVar13 - lVar8) {
              uVar9 = local_50;
            }
            uVar12 = uVar9 & 0xffffffff;
            local_88 = lVar8;
            if (0 < (int)local_50) {
              memset(__s_00,0,local_48);
            }
            local_80 = uVar12;
            local_60 = uVar12;
            if (0 < (int)uVar9) {
              lVar8 = 0;
              lVar11 = 0;
              lVar13 = local_88;
              do {
                uVar4 = ref_node_local(local_98,lVar13,&local_6c);
                if ((uVar4 != 0) && (uVar4 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x4ca,"ref_gather_node",(ulong)uVar4,"node local failed");
                  local_ac = uVar4;
                }
                if (uVar4 == 5) {
LAB_001a9896:
                  puVar1 = (undefined8 *)((long)__s_00 + lVar8 * 8);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  uVar14 = 0;
                  uVar15 = 0;
                  uVar16 = 0;
                  lVar6 = lVar8;
                }
                else {
                  if (uVar4 != 0) {
                    return local_ac;
                  }
                  lVar6 = (long)local_6c;
                  if (local_90->id != local_98->part[lVar6]) goto LAB_001a9896;
                  pRVar2 = local_98->real;
                  *(REF_DBL *)((long)__s_00 + lVar8 * 8) = pRVar2[lVar6 * 0xf];
                  *(REF_DBL *)((long)__s_00 + lVar8 * 8 + 8) = pRVar2[lVar6 * 0xf + 1];
                  uVar14 = SUB84(pRVar2[lVar6 * 0xf + 2],0);
                  uVar15 = (undefined4)((ulong)pRVar2[lVar6 * 0xf + 2] >> 0x20);
                  uVar16 = 0x3ff0000000000000;
                  lVar6 = lVar11 * 4;
                }
                *(ulong *)((long)__s_00 + lVar6 * 8 + 0x10) = CONCAT44(uVar15,uVar14);
                *(undefined8 *)((long)__s_00 + lVar6 * 8 + 0x18) = uVar16;
                lVar11 = lVar11 + 1;
                lVar13 = lVar13 + 1;
                lVar8 = lVar8 + 4;
              } while (uVar12 * 4 - lVar8 != 0);
            }
            __ptr = local_68;
            uVar4 = ref_mpi_sum(local_90,__s_00,local_68,(int)local_80 * 4,3);
            __s = local_40;
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x4d9,"ref_gather_node",(ulong)uVar4,"sum");
              return uVar4;
            }
            if ((local_90->id == 0) && (0 < (int)local_80)) {
              local_60 = local_60 << 5;
              uVar9 = 0;
              lVar13 = local_88;
              do {
                dVar17 = *(double *)((long)__ptr + uVar9 + 0x18) + -1.0;
                if (dVar17 <= -dVar17) {
                  dVar17 = -dVar17;
                }
                if (0.1 < dVar17) {
                  printf("error gather node %ld %f\n",lVar13);
                  local_9c = 1;
                }
                local_a8 = *(ulong *)((long)__ptr + uVar9);
                if (local_a0 != 0) {
                  local_a8 = local_a8 >> 0x38 | (local_a8 & 0xff000000000000) >> 0x28 |
                             (local_a8 & 0xff0000000000) >> 0x18 | (local_a8 & 0xff00000000) >> 8 |
                             (local_a8 & 0xff000000) << 8 | (local_a8 & 0xff0000) << 0x18 |
                             (local_a8 & 0xff00) << 0x28 | local_a8 << 0x38;
                }
                sVar7 = fwrite(&local_a8,8,1,__s);
                if (sVar7 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x4e4,"ref_gather_node","x",1,sVar7);
                  return 1;
                }
                local_a8 = *(ulong *)((long)__ptr + uVar9 + 8);
                if (local_a0 != 0) {
                  local_a8 = local_a8 >> 0x38 | (local_a8 & 0xff000000000000) >> 0x28 |
                             (local_a8 & 0xff0000000000) >> 0x18 | (local_a8 & 0xff00000000) >> 8 |
                             (local_a8 & 0xff000000) << 8 | (local_a8 & 0xff0000) << 0x18 |
                             (local_a8 & 0xff00) << 0x28 | local_a8 << 0x38;
                }
                sVar7 = fwrite(&local_a8,8,1,__s);
                if (sVar7 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x4e7,"ref_gather_node","y",1,sVar7);
                  return 1;
                }
                if (local_70 == 0) {
                  local_a8 = *(ulong *)((long)__ptr + uVar9 + 0x10);
                  if (local_a0 != 0) {
                    local_a8 = local_a8 >> 0x38 | (local_a8 & 0xff000000000000) >> 0x28 |
                               (local_a8 & 0xff0000000000) >> 0x18 | (local_a8 & 0xff00000000) >> 8
                               | (local_a8 & 0xff000000) << 8 | (local_a8 & 0xff0000) << 0x18 |
                               (local_a8 & 0xff00) << 0x28 | local_a8 << 0x38;
                  }
                  sVar7 = fwrite(&local_a8,8,1,__s);
                  if (sVar7 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x4eb,"ref_gather_node","z",1,sVar7);
                    return 1;
                  }
                }
                if ((local_74 < 4) &&
                   (RVar5 = ref_gather_meshb_int((FILE *)__s,(REF_INT)local_38,1), RVar5 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x4ef,"ref_gather_node",1,"nnode");
                  return 1;
                }
                uVar9 = uVar9 + 0x20;
                lVar13 = lVar13 + 1;
              } while (local_60 != uVar9);
            }
            lVar8 = local_88 + (int)local_80;
            lVar13 = local_98->old_n_global;
          } while (lVar8 < lVar13);
        }
        free(__ptr);
        free(__s_00);
        uVar4 = ref_mpi_all_or(local_90,&local_9c);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x4f6,"ref_gather_node",(ulong)uVar4,"all gather error code");
          return uVar4;
        }
        if (local_9c == 0) {
          return 0;
        }
        pcVar10 = "node used more or less than once";
        uVar16 = 0x4f7;
        goto LAB_001a9c02;
      }
      pcVar10 = "malloc xyzm of REF_DBL NULL";
      uVar16 = 0x4bb;
      local_68 = (void *)0x0;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar16
           ,"ref_gather_node",pcVar10);
    local_ac = 2;
  }
  return local_ac;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node(REF_NODE ref_node,
                                          REF_BOOL swap_endian, REF_INT version,
                                          REF_BOOL twod, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_DBL swapped_dbl;
  REF_GLOB nnode_written, first, global;
  REF_INT n, i;
  REF_INT local;
  REF_STATUS status;
  REF_BOOL node_not_used_once = REF_FALSE;

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk = MIN(
      chunk, ref_mpi_reduce_chunk_limit(ref_mpi, 4 * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, 4 * chunk, REF_DBL);
  ref_malloc(xyzm, 4 * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;

    for (i = 0; i < 4 * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        local_xyzm[0 + 4 * i] = ref_node_xyz(ref_node, 0, local);
        local_xyzm[1 + 4 * i] = ref_node_xyz(ref_node, 1, local);
        local_xyzm[2 + 4 * i] = ref_node_xyz(ref_node, 2, local);
        local_xyzm[3 + 4 * i] = 1.0;
      } else {
        local_xyzm[0 + 4 * i] = 0.0;
        local_xyzm[1 + 4 * i] = 0.0;
        local_xyzm[2 + 4 * i] = 0.0;
        local_xyzm[3 + 4 * i] = 0.0;
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, 4 * n, REF_DBL_TYPE), "sum");

    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[3 + 4 * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[3 + 4 * i]);
          node_not_used_once = REF_TRUE;
        }
        swapped_dbl = xyzm[0 + 4 * i];
        if (swap_endian) SWAP_DBL(swapped_dbl);
        REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "x");
        swapped_dbl = xyzm[1 + 4 * i];
        if (swap_endian) SWAP_DBL(swapped_dbl);
        REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "y");
        if (!twod) {
          swapped_dbl = xyzm[2 + 4 * i];
          if (swap_endian) SWAP_DBL(swapped_dbl);
          REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "z");
        }
        if (1 <= version && version <= 4)
          RSS(ref_gather_meshb_int(file, version, REF_EXPORT_MESHB_VERTEX_ID),
              "nnode");
      }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  RSS(ref_mpi_all_or(ref_mpi, &node_not_used_once), "all gather error code");
  RAS(!node_not_used_once, "node used more or less than once");

  return REF_SUCCESS;
}